

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triangulated_Surface.h
# Opt level: O0

void __thiscall
Nova::Triangulated_Surface<double>::Triangulated_Surface
          (Triangulated_Surface<double> *this,Array<Nova::Vector<double,_3,_true>_> *points_input,
          Array<Nova::Vector<int,_3,_true>_> *elements_input)

{
  size_t number_of_nodes_input;
  Array<Nova::Vector<int,_3,_true>_> *elements_input_local;
  Array<Nova::Vector<double,_3,_true>_> *points_input_local;
  Triangulated_Surface<double> *this_local;
  
  Point_Cloud<double,_3>::Point_Cloud(&this->super_Point_Cloud<double,_3>,points_input);
  number_of_nodes_input = Array<Nova::Vector<double,_3,_true>_>::size(points_input);
  Simplex_Mesh<3>::Simplex_Mesh(&this->super_Simplex_Mesh<3>,number_of_nodes_input,elements_input);
  return;
}

Assistant:

Triangulated_Surface(const Array<TV>& points_input,const Array<INDEX>& elements_input)
        :Point_Base(points_input),Mesh_Base(points_input.size(),elements_input)
    {}